

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void processServiceResponse
               (ResponseDescription *rd,UA_SecureChannel *channel,UA_MessageType messageType,
               UA_UInt32 requestId,UA_ByteString *message)

{
  void *pvVar1;
  UA_Logger logger;
  UA_Boolean UVar2;
  UA_StatusCode UVar3;
  char *pcVar4;
  UA_DataType *type;
  void *dst;
  UA_StatusCode UVar5;
  UA_TcpErrorMessage *msg;
  uint uVar6;
  undefined1 local_78 [8];
  UA_NodeId serviceFaultNodeId;
  UA_NodeId expectedNodeId;
  UA_NodeId responseId;
  size_t offset;
  
  serviceFaultNodeId.identifier._8_2_ = 0;
  serviceFaultNodeId.identifier._12_4_ = 0;
  uVar6 = (uint)rd->responseType->binaryEncodingId;
  local_78._0_2_ = 0;
  stack0xffffffffffffff8c = 0x18d00000000;
  pvVar1 = rd->response;
  rd->processed = true;
  expectedNodeId._0_4_ = uVar6;
  if (messageType == UA_MESSAGETYPE_MSG) {
    if (rd->requestId != requestId) {
      UA_LOG_ERROR((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,
                   "Reply answers the wrong requestId. Async services are not yet implemented.");
LAB_00123874:
      UVar5 = 0x80020000;
      goto LAB_0012387a;
    }
    responseId.identifier.string.data = (UA_Byte *)0x0;
    UVar3 = UA_NodeId_decodeBinary
                      (message,(size_t *)responseId.identifier.guid.data4,
                       (UA_NodeId *)((long)&expectedNodeId.identifier + 8));
    if (UVar3 == 0) {
      UVar2 = UA_NodeId_equal((UA_NodeId *)((long)&expectedNodeId.identifier + 8),
                              (UA_NodeId *)((long)&serviceFaultNodeId.identifier + 8));
      if (UVar2) {
        dst = rd->response;
        type = rd->responseType;
      }
      else {
        UVar2 = UA_NodeId_equal((UA_NodeId *)((long)&expectedNodeId.identifier + 8),
                                (UA_NodeId *)local_78);
        if (!UVar2) {
          UA_LOG_ERROR((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,
                       "Reply answers the wrong request. Expected ns=%i,i=%i.But retrieved ns=%i,i=%i"
                       ,0,(ulong)uVar6,(ulong)(ushort)expectedNodeId.identifier._8_2_,
                       responseId._0_4_);
          UA_NodeId_deleteMembers((UA_NodeId *)((long)&expectedNodeId.identifier + 8));
          goto LAB_00123874;
        }
        dst = rd->response;
        type = UA_TYPES + 0x90;
      }
      UVar3 = UA_decodeBinary(message,(size_t *)responseId.identifier.guid.data4,dst,type);
      goto LAB_00123805;
    }
  }
  else {
    if (messageType != UA_MESSAGETYPE_ERR) {
      UA_LOG_ERROR((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,
                   "Server replied with the wrong message type");
      UVar5 = 0x807e0000;
      goto LAB_0012387a;
    }
    logger = (rd->client->config).logger;
    pcVar4 = UA_StatusCode_name((UA_StatusCode)message->length);
    UA_LOG_ERROR(logger,UA_LOGCATEGORY_CLIENT,"Server replied with an error message: %s %.*s",pcVar4
                 ,message->data,message[1].length);
    UVar3 = (UA_StatusCode)message->length;
LAB_00123805:
    if (UVar3 == 0) {
      return;
    }
  }
  UVar5 = 0x80b90000;
  if (UVar3 != 0x80080000) {
    UVar5 = UVar3;
  }
LAB_0012387a:
  UA_LOG_INFO((rd->client->config).logger,UA_LOGCATEGORY_CLIENT,"Error receiving the response");
  *(UA_StatusCode *)((long)pvVar1 + 0xc) = UVar5;
  return;
}

Assistant:

static void
processServiceResponse(struct ResponseDescription *rd, UA_SecureChannel *channel,
                       UA_MessageType messageType, UA_UInt32 requestId,
                       UA_ByteString *message) {
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    const UA_NodeId expectedNodeId =
        UA_NODEID_NUMERIC(0, rd->responseType->binaryEncodingId);
    const UA_NodeId serviceFaultNodeId =
        UA_NODEID_NUMERIC(0, UA_TYPES[UA_TYPES_SERVICEFAULT].binaryEncodingId);

    UA_ResponseHeader *respHeader = (UA_ResponseHeader*)rd->response;
    rd->processed = true;

    if(messageType == UA_MESSAGETYPE_ERR) {
        UA_TcpErrorMessage *msg = (UA_TcpErrorMessage*)message;
        UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Server replied with an error message: %s %.*s",
                     UA_StatusCode_name(msg->error), msg->reason.length, msg->reason.data);
        retval = msg->error;
        goto finish;
    } else if(messageType != UA_MESSAGETYPE_MSG) {
        UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Server replied with the wrong message type");
        retval = UA_STATUSCODE_BADTCPMESSAGETYPEINVALID;
        goto finish;
    }

    /* Check that the request id matches */
    /* Todo: we need to demux async responses since a publish responses may come
       at any time */
    if(requestId != rd->requestId) {
        UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Reply answers the wrong requestId. "
                     "Async services are not yet implemented.");
        retval = UA_STATUSCODE_BADINTERNALERROR;
        goto finish;
    }

    /* Check that the response type matches */
    size_t offset = 0;
    UA_NodeId responseId;
    retval = UA_NodeId_decodeBinary(message, &offset, &responseId);
    if(retval != UA_STATUSCODE_GOOD)
        goto finish;
    if(!UA_NodeId_equal(&responseId, &expectedNodeId)) {
        if(UA_NodeId_equal(&responseId, &serviceFaultNodeId)) {
            /* Take the statuscode from the servicefault */
            retval = UA_decodeBinary(message, &offset, rd->response,
                                     &UA_TYPES[UA_TYPES_SERVICEFAULT]);
        } else {
            UA_LOG_ERROR(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                         "Reply answers the wrong request. Expected ns=%i,i=%i."
                         "But retrieved ns=%i,i=%i", expectedNodeId.namespaceIndex,
                         expectedNodeId.identifier.numeric, responseId.namespaceIndex,
                         responseId.identifier.numeric);
            UA_NodeId_deleteMembers(&responseId);
            retval = UA_STATUSCODE_BADINTERNALERROR;
        }
        goto finish;
    }

    /* Decode the response */
    retval = UA_decodeBinary(message, &offset, rd->response, rd->responseType);

 finish:
    if(retval == UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                     "Received a response of type %i", responseId.identifier.numeric);
    } else {
        if(retval == UA_STATUSCODE_BADENCODINGLIMITSEXCEEDED)
            retval = UA_STATUSCODE_BADRESPONSETOOLARGE;
        UA_LOG_INFO(rd->client->config.logger, UA_LOGCATEGORY_CLIENT,
                    "Error receiving the response");
        respHeader->serviceResult = retval;
    }
}